

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseParams
          (StructTranslator *this,Reader params,MemberInfo *parent,StructOrGroup *layout)

{
  ulong uVar1;
  uint i;
  Reader param;
  ElementCount local_94;
  MemberInfo *local_90;
  Arena *local_88;
  StructOrGroup *local_80;
  ulong local_78;
  pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> local_70;
  StructReader local_60;
  
  local_78 = (ulong)params.reader.elementCount;
  local_88 = &this->arena;
  local_80 = layout;
  for (uVar1 = 0; local_78 != uVar1; uVar1 = uVar1 + 1) {
    local_94 = (ElementCount)uVar1;
    capnp::_::ListReader::getStructElement(&local_60,&params.reader,local_94);
    parent->childCount = parent->childCount + 1;
    local_70.first = local_70.first & 0xffffff00;
    local_90 = kj::Arena::
               allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int&,capnp::compiler::Declaration::Param::Reader&,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&,bool>
                         (local_88,parent,&local_94,(Reader *)&local_60,local_80,(bool *)&local_70);
    kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
    add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
              ((Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *)
               &this->allMembers,&local_90);
    local_70.first = local_94;
    local_70.second = local_90;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
    ::
    _M_emplace_equal<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
                *)&this->membersByOrdinal,&local_70);
  }
  return;
}

Assistant:

void traverseParams(List<Declaration::Param>::Reader params, MemberInfo& parent,
                      StructLayout::StructOrGroup& layout) {
    for (uint i: kj::indices(params)) {
      auto param = params[i];
      parent.childCount++;
      MemberInfo* memberInfo = &arena.allocate<MemberInfo>(parent, i, param, layout, false);
      allMembers.add(memberInfo);
      membersByOrdinal.insert(std::make_pair(i, memberInfo));
    }
  }